

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.cc
# Opt level: O3

uint __thiscall
cnn::ClassFactoredSoftmaxBuilder::sample(ClassFactoredSoftmaxBuilder *this,Expression *rep)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  ComputationGraph *pCVar4;
  Tensor *pTVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  vector<float,_std::allocator<float>_> wdist;
  vector<float,_std::allocator<float>_> cdist;
  Expression wscores;
  Expression cscores;
  undefined1 local_a8 [48];
  vector<float,_std::allocator<float>_> local_78;
  Expression local_60;
  initializer_list<cnn::expr::Expression> local_50;
  Expression local_40;
  
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_a8;
  local_a8._0_8_ = (this->cbias).pg;
  local_a8._8_4_ = (this->cbias).i.t;
  local_a8._16_8_ = (this->r2c).pg;
  local_a8._24_4_ = (this->r2c).i.t;
  local_a8._32_8_ = rep->pg;
  local_a8._40_4_ = (rep->i).t;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3;
  expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
            ((detail *)&local_40,(initializer_list<cnn::expr::Expression> *)&local_78);
  expr::softmax((expr *)local_a8,&local_40);
  pTVar5 = ComputationGraph::incremental_forward(this->pcg);
  as_vector(&local_78,pTVar5);
  fVar11 = rand01();
  uVar6 = (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar9 = 0;
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    do {
      uVar9 = (uint)uVar10;
      fVar11 = fVar11 - *(float *)((long)(_func_int ***)
                                         local_78.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start + uVar10 * 4);
      if (fVar11 < 0.0) break;
      uVar9 = uVar9 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar10 < uVar6);
  }
  uVar9 = uVar9 - (uVar6 == uVar10);
  uVar6 = (ulong)uVar9;
  if (((this->singleton_cluster).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] >> (uVar6 & 0x3f)
      & 1) == 0) {
    pEVar2 = (this->rc2biases).
             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar1 = pEVar2 + uVar6;
    if (pEVar2[uVar6].pg == (ComputationGraph *)0x0) {
      expr::parameter((ComputationGraph *)local_a8,(Parameters *)this->pcg);
      pEVar1->pg = (ComputationGraph *)local_a8._0_8_;
      (pEVar1->i).t = local_a8._8_4_;
    }
    pEVar3 = (this->rc2ws).
             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar2 = pEVar3 + uVar6;
    pCVar4 = pEVar3[uVar6].pg;
    if (pCVar4 == (ComputationGraph *)0x0) {
      expr::parameter((ComputationGraph *)local_a8,(Parameters *)this->pcg);
      pEVar2->pg = (ComputationGraph *)local_a8._0_8_;
      (pEVar2->i).t = local_a8._8_4_;
    }
    else {
      local_a8._8_4_ = (pEVar2->i).t;
      local_a8._0_8_ = pCVar4;
    }
    local_a8._32_8_ = rep->pg;
    local_a8._40_4_ = (rep->i).t;
    local_50._M_len = 3;
    local_a8._16_8_ = local_a8._0_8_;
    local_a8._0_8_ = pEVar1->pg;
    local_a8._24_4_ = local_a8._8_4_;
    local_a8._8_4_ = (pEVar1->i).t;
    local_50._M_array = (iterator)local_a8;
    expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&local_60,&local_50);
    expr::softmax((expr *)local_a8,&local_60);
    pTVar5 = ComputationGraph::incremental_forward(this->pcg);
    as_vector((vector<float,_std::allocator<float>_> *)local_a8,pTVar5);
    fVar11 = rand01();
    lVar7 = CONCAT44(local_a8._12_4_,local_a8._8_4_) - local_a8._0_8_;
    if (lVar7 == 0) {
      uVar10 = 0xffffffff;
      if ((ComputationGraph *)local_a8._0_8_ == (ComputationGraph *)0x0) {
        uVar10 = 0xffffffff;
        goto LAB_001775a0;
      }
    }
    else {
      uVar8 = lVar7 >> 2;
      uVar10 = 0;
      do {
        fVar11 = fVar11 - *(float *)((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                             local_a8._0_8_)->
                                            super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar10 * 4)
        ;
        if (fVar11 < 0.0) goto LAB_00177593;
        uVar9 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar9;
      } while (uVar10 <= uVar8 && uVar8 != uVar10);
      uVar10 = (ulong)(uVar9 - (uVar8 == uVar10));
    }
LAB_00177593:
    operator_delete((void *)local_a8._0_8_);
  }
  else {
    uVar10 = 0;
  }
LAB_001775a0:
  uVar9 = *(uint *)(*(long *)&(this->cidx2words).
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar6].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + uVar10 * 4);
  if ((ExecutionEngine *)
      local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (ExecutionEngine *)0x0) {
    operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return uVar9;
}

Assistant:

unsigned ClassFactoredSoftmaxBuilder::sample(const expr::Expression& rep) {
  // TODO assert that new_graph has been called
  Expression cscores = affine_transform({cbias, r2c, rep});
  softmax(cscores);
  auto cdist = as_vector(pcg->incremental_forward());
  unsigned c = 0;
  double p = rand01();
  for (; c < cdist.size(); ++c) {
    p -= cdist[c];
    if (p < 0.0) { break; }
  }
  if (c == cdist.size()) --c;
  unsigned w = 0;
  if (!singleton_cluster[c]) {
    Expression& cwbias = get_rc2wbias(c);
    Expression& r2cw = get_rc2w(c);
    Expression wscores = affine_transform({cwbias, r2cw, rep});
    softmax(wscores);
    auto wdist = as_vector(pcg->incremental_forward());
    p = rand01();
    for (; w < wdist.size(); ++w) {
      p -= wdist[w];
      if (p < 0.0) { break; }
    }
    if (w == wdist.size()) --w;
  }
  return cidx2words[c][w];
}